

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

statement_base * __thiscall
cs::method_catch::translate
          (method_catch *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  value_type ptVar1;
  _func_int **pp_Var2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Elt_pointer pdVar5;
  token_base *ptVar6;
  int iVar7;
  const_reference pptVar8;
  token_base **pptVar9;
  statement_base *psVar10;
  internal_error *this_00;
  compile_error *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Elt_pointer pptVar11;
  size_t size;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  undefined1 local_68 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  size_t sStack_30;
  
  size = 1;
  pptVar8 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar1 = *pptVar8;
  local_68._0_8_ = ptVar1[1]._vptr_token_base;
  pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_68);
  if (*pptVar9 == (token_base *)0x0) {
    this_00 = (internal_error *)__cxa_allocate_exception(0x28);
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Null pointer accessed.","");
    internal_error::internal_error(this_00,(string *)local_68);
    __cxa_throw(this_00,&internal_error::typeinfo,internal_error::~internal_error);
  }
  local_68._0_8_ = ptVar1[1]._vptr_token_base;
  pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_68);
  iVar7 = (*(*pptVar9)->_vptr_token_base[2])();
  if (iVar7 == 4) {
    psVar10 = (statement_base *)statement_base::operator_new((statement_base *)0x40,size);
    local_68._0_8_ = ptVar1[1]._vptr_token_base;
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_68);
    pp_Var2 = (*pptVar9)[3]._vptr_token_base;
    local_48 = &local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pp_Var2,(*pptVar9)[3].line_num + (long)pp_Var2);
    peVar3 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var4 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    pdVar5 = (raw->
             super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar11 = (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar11 ==
        (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pptVar11 = (pdVar5->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ptVar6 = pptVar11[-1];
    (psVar10->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar3;
    (psVar10->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var4;
    psVar10->line_num = ptVar6->line_num;
    psVar10->_vptr_statement_base = (_func_int **)&PTR__statement_catch_003343d8;
    p_Var12 = &psVar10[1].context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    psVar10[1]._vptr_statement_base = (_func_int **)p_Var12;
    if (local_48 == &local_38) {
      p_Var12->_M_pi = local_38._M_pi;
      psVar10[1].line_num = sStack_30;
    }
    else {
      psVar10[1]._vptr_statement_base = (_func_int **)local_48;
      psVar10[1].context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = local_38._M_pi;
    }
    psVar10[1].context.super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_40;
    return psVar10;
  }
  this_01 = (compile_error *)__cxa_allocate_exception(0x28);
  local_68._0_8_ = local_68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"Wrong grammar for catch statement, expect <id>","");
  compile_error::compile_error(this_01,(string *)local_68);
  __cxa_throw(this_01,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

statement_base *method_catch::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &t = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (t.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (t.root().data()->get_type() != token_types::id)
			throw compile_error("Wrong grammar for catch statement, expect <id>");
		return new statement_catch(static_cast<token_id *>(t.root().data())->get_id(), context, raw.front().back());
	}